

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Attach_Stream(FT_Face face,FT_Open_Args *parameters)

{
  FT_Driver pFVar1;
  FT_Face_AttachFunc p_Var2;
  FT_Memory pFVar3;
  FT_Error FVar4;
  bool bVar5;
  FT_Stream stream;
  FT_Stream local_30;
  
  if (face == (FT_Face)0x0) {
    FVar4 = 0x23;
  }
  else {
    pFVar1 = face->driver;
    if (pFVar1 == (FT_Driver)0x0) {
      FVar4 = 0x22;
    }
    else {
      FVar4 = FT_Stream_New((pFVar1->root).library,parameters,&local_30);
      if (FVar4 == 0) {
        p_Var2 = pFVar1->clazz->attach_file;
        if (p_Var2 == (FT_Face_AttachFunc)0x0) {
          FVar4 = 7;
        }
        else {
          FVar4 = (*p_Var2)(face,local_30);
        }
        if (parameters->stream == (FT_Stream)0x0) {
          bVar5 = true;
        }
        else {
          bVar5 = (parameters->flags & 2) == 0;
        }
        if (local_30 != (FT_Stream)0x0) {
          pFVar3 = local_30->memory;
          if (local_30->close != (FT_Stream_CloseFunc)0x0) {
            (*local_30->close)(local_30);
          }
          if (bVar5) {
            (*pFVar3->free)(pFVar3,local_30);
          }
        }
      }
    }
  }
  return FVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Attach_Stream( FT_Face              face,
                    const FT_Open_Args*  parameters )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Driver  driver;

    FT_Driver_Class  clazz;


    /* test for valid `parameters' delayed to `FT_Stream_New' */

    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    driver = face->driver;
    if ( !driver )
      return FT_THROW( Invalid_Driver_Handle );

    error = FT_Stream_New( driver->root.library, parameters, &stream );
    if ( error )
      goto Exit;

    /* we implement FT_Attach_Stream in each driver through the */
    /* `attach_file' interface                                  */

    error = FT_ERR( Unimplemented_Feature );
    clazz = driver->clazz;
    if ( clazz->attach_file )
      error = clazz->attach_file( face, stream );

    /* close the attached stream */
    FT_Stream_Free( stream,
                    FT_BOOL( parameters->stream                     &&
                             ( parameters->flags & FT_OPEN_STREAM ) ) );

  Exit:
    return error;
  }